

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::SetRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this,
          TPZAutoPointer<TPZRefPattern> *refpat)

{
  TPZReference *pTVar1;
  TPZRefPattern *pTVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  pTVar1 = (this->fRefPattern).fRef;
  if (((pTVar1 != (TPZReference *)0x0) &&
      (pTVar2 = pTVar1->fPointer, pTVar2 != (TPZRefPattern *)0x0)) &&
     (iVar4 = TPZRefPattern::operator==(pTVar2,refpat->fRef->fPointer), iVar4 != 0)) {
    return;
  }
  iVar4 = (**(code **)(*(long *)&(this->
                                 super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>
                                 ).super_TPZGeoEl + 0x1d0))(this);
  if (iVar4 != 0) {
    std::operator<<((ostream *)&std::cout,
                    "Trying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n"
                   );
    return;
  }
  TPZAutoPointer<TPZRefPattern>::operator=(&this->fRefPattern,refpat);
  if ((refpat->fRef != (TPZReference *)0x0) &&
     (pTVar2 = refpat->fRef->fPointer, pTVar2 != (TPZRefPattern *)0x0)) {
    uVar5 = TPZRefPattern::NSubElements(pTVar2);
    TPZVec<long>::Resize(&this->fSubEl,(long)(int)uVar5);
    plVar3 = (this->fSubEl).fStore;
    uVar6 = 0;
    uVar7 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      plVar3[uVar6] = -1;
    }
    return;
  }
  TPZVec<long>::Resize(&this->fSubEl,0);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::SetRefPattern (TPZAutoPointer<TPZRefPattern> refpat){
	
#ifdef HUGE_DEBUG
	if (!refpat) {
		PZError << "Error trying to set a null refinement pattern objetct" << std::endl;
		return;
	}
#endif
	
	if(fRefPattern && (*fRefPattern == *refpat)){//they are the same refinement pattern
		return;
	}
	else if(this->HasSubElement())
	{
#ifdef PZ_LOG
        TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
		LOGPZ_ERROR ( loggerrefpattern, "\nTrying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n" );
#endif
		std::cout << "Trying to set an refPattern to geoEl that is already refined!\nThis try was skipped!\n\n";
		
		return;
	}
	fRefPattern = refpat;
    if(!refpat)
    {
        fSubEl.Resize(0);
    }
    else
    {
        int nsubel = refpat->NSubElements();
        fSubEl.Resize(nsubel);
        for(int i=0;i<nsubel;i++) fSubEl[i] = -1;
    }
}